

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderXFB.cpp
# Opt level: O3

IterateResult __thiscall glcts::TessellationShaderXFB::iterate(TessellationShaderXFB *this)

{
  GLenum GVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  void *__s;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  NotSupportedError *this_00;
  GLuint GVar8;
  long lVar9;
  _test_descriptor *p_Var10;
  bool **ppbVar11;
  float *pfVar12;
  char *pcVar13;
  long lVar14;
  bool **ppbVar15;
  ulong uVar16;
  long lVar17;
  bool **ppbVar18;
  float fVar19;
  float fVar20;
  GLint validate_status;
  _tests tests;
  _test_descriptor test_2;
  _test_descriptor test_1;
  float local_2b4;
  _test_descriptor *local_2b0;
  _test_descriptor *local_2a8;
  iterator iStack_2a0;
  _test_descriptor *local_298;
  _test_descriptor local_288;
  uint local_274;
  _test_descriptor local_270;
  bool *local_258 [2];
  undefined4 local_248 [4];
  undefined4 local_238 [4];
  bool *local_228;
  TessellationShaderXFB *local_220;
  bool *local_218;
  undefined4 local_210 [2];
  undefined4 local_208 [2];
  bool *local_200;
  bool *local_1f8;
  float local_1f0;
  undefined8 local_1ec;
  undefined4 local_1e4;
  float local_1e0;
  undefined1 local_1dc [12];
  ulong local_1d0;
  _test_descriptor local_1c8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  local_1c8.should_draw_call_fail = false;
  local_1c8.requires_pipeline = false;
  local_1c8.expected_data_source = 0;
  local_1c8.expected_n_values = 0;
  local_1c8.tf_mode = 0;
  local_1c8.use_gs = false;
  local_1c8.use_tc = false;
  local_1c8.use_te = false;
  local_270.should_draw_call_fail = false;
  local_270.requires_pipeline = false;
  local_270.expected_data_source = 0;
  local_270.expected_n_values = 0;
  local_270.tf_mode = 0;
  local_270.use_gs = false;
  local_270.use_tc = false;
  local_270.use_te = false;
  local_288._8_4_ = (uint)(ushort)local_288._10_2_ << 0x10;
  local_288.expected_data_source = 0;
  local_288.expected_n_values = 0;
  local_288.tf_mode = 0;
  local_288.use_gs = false;
  local_288.use_tc = false;
  local_288.use_te = false;
  local_298 = (_test_descriptor *)0x0;
  local_2a8 = (_test_descriptor *)0x0;
  iStack_2a0._M_current = (_test_descriptor *)0x0;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
    local_1c8.expected_n_values = 2;
    local_1c8.expected_data_source = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER;
    local_1c8.should_draw_call_fail = false;
    local_1c8.requires_pipeline = false;
    local_1c8.tf_mode = 0;
    local_1c8.use_gs = true;
    local_1c8.use_tc = true;
    local_1c8.use_te = true;
    std::
    vector<glcts::TessellationShaderXFB::_test_descriptor,std::allocator<glcts::TessellationShaderXFB::_test_descriptor>>
    ::_M_realloc_insert<glcts::TessellationShaderXFB::_test_descriptor_const&>
              ((vector<glcts::TessellationShaderXFB::_test_descriptor,std::allocator<glcts::TessellationShaderXFB::_test_descriptor>>
                *)&local_2a8,(iterator)0x0,&local_1c8);
  }
  local_270.expected_data_source = (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER;
  local_270.expected_n_values = 2;
  local_270._8_4_ = (uint)(ushort)local_270._10_2_ << 0x10;
  local_270.tf_mode = 0;
  local_270.use_gs = false;
  local_270.use_tc = true;
  local_270.use_te = true;
  if (iStack_2a0._M_current == local_298) {
    std::
    vector<glcts::TessellationShaderXFB::_test_descriptor,std::allocator<glcts::TessellationShaderXFB::_test_descriptor>>
    ::_M_realloc_insert<glcts::TessellationShaderXFB::_test_descriptor_const&>
              ((vector<glcts::TessellationShaderXFB::_test_descriptor,std::allocator<glcts::TessellationShaderXFB::_test_descriptor>>
                *)&local_2a8,iStack_2a0,&local_270);
  }
  else {
    (iStack_2a0._M_current)->use_gs = (bool)(char)0x10100;
    (iStack_2a0._M_current)->use_tc = (bool)(char)(0x10100 >> 8);
    (iStack_2a0._M_current)->use_te = (bool)(char)(0x10100 >> 0x10);
    (iStack_2a0._M_current)->field_0x13 = local_270._19_1_;
    (iStack_2a0._M_current)->expected_data_source = local_270.expected_data_source;
    (iStack_2a0._M_current)->expected_n_values = 2;
    (iStack_2a0._M_current)->should_draw_call_fail = local_270.should_draw_call_fail;
    (iStack_2a0._M_current)->requires_pipeline = local_270.requires_pipeline;
    *(undefined2 *)&(iStack_2a0._M_current)->field_0xa = local_270._10_2_;
    (iStack_2a0._M_current)->tf_mode = 0;
    iStack_2a0._M_current = iStack_2a0._M_current + 1;
  }
  local_288.expected_n_values = 4;
  local_288.expected_data_source = (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER;
  uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar3 & 0x300) != 0) {
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"GL_NV_gpu_shader5","");
    bVar2 = TestCaseBase::isExtensionSupported(&this->super_TestCaseBase,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_288._8_4_ = local_288._8_4_ & 0xffffff00;
      local_288.tf_mode = (this->super_TestCaseBase).m_glExtTokens.PATCHES;
      goto LAB_00cc38f2;
    }
  }
  local_288.should_draw_call_fail = true;
  local_288.tf_mode = 0;
LAB_00cc38f2:
  local_288.requires_pipeline = true;
  local_288.use_gs = false;
  local_288.use_tc = true;
  local_288.use_te = false;
  if (iStack_2a0._M_current == local_298) {
    std::
    vector<glcts::TessellationShaderXFB::_test_descriptor,std::allocator<glcts::TessellationShaderXFB::_test_descriptor>>
    ::_M_realloc_insert<glcts::TessellationShaderXFB::_test_descriptor_const&>
              ((vector<glcts::TessellationShaderXFB::_test_descriptor,std::allocator<glcts::TessellationShaderXFB::_test_descriptor>>
                *)&local_2a8,iStack_2a0,&local_288);
  }
  else {
    (iStack_2a0._M_current)->use_gs = (bool)(char)0x100;
    (iStack_2a0._M_current)->use_tc = (bool)(char)(0x100 >> 8);
    (iStack_2a0._M_current)->use_te = (bool)(char)(0x100 >> 0x10);
    (iStack_2a0._M_current)->field_0x13 = local_288._19_1_;
    (iStack_2a0._M_current)->expected_data_source = local_288.expected_data_source;
    (iStack_2a0._M_current)->expected_n_values = local_288.expected_n_values;
    (iStack_2a0._M_current)->should_draw_call_fail = local_288.should_draw_call_fail;
    (iStack_2a0._M_current)->requires_pipeline = true;
    *(undefined2 *)&(iStack_2a0._M_current)->field_0xa = local_288._10_2_;
    (iStack_2a0._M_current)->tf_mode = local_288.tf_mode;
    iStack_2a0._M_current = iStack_2a0._M_current + 1;
  }
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar9 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glPatchParameteriEXT() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                  ,0x281);
  local_274 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  uVar16 = 0;
  local_220 = this;
  local_1dc._4_8_ = lVar9;
  do {
    if ((uVar16 & 1) == 0) {
      (**(code **)(lVar9 + 0x98))(0);
      dVar5 = (**(code **)(lVar9 + 0x800))();
      iVar4 = 0x299;
      pcVar13 = "glBindProgramPipeline() failed.";
    }
    else {
      (**(code **)(lVar9 + 0x98))(this->m_pipeline_id);
      dVar5 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar5,"glBindProgramPipeline() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                      ,0x291);
      (**(code **)(lVar9 + 0x1680))(0);
      dVar5 = (**(code **)(lVar9 + 0x800))();
      iVar4 = 0x294;
      pcVar13 = "glUseProgram() failed";
    }
    glu::checkError(dVar5,pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                    ,iVar4);
    p_Var10 = local_2a8;
    local_1d0 = uVar16;
    if (local_2a8 != iStack_2a0._M_current) {
      do {
        local_2b0 = p_Var10;
        if ((uVar16 & 1) == 0) {
          if (p_Var10->requires_pipeline == false) {
            if (p_Var10->use_gs == true) {
              (**(code **)(lVar9 + 0x10))(this->m_po_id,this->m_gs_id);
              dVar5 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar5,"Could not attach geometry shader",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                              ,0x2d7);
            }
            if (p_Var10->use_tc == true) {
              (**(code **)(lVar9 + 0x10))(this->m_po_id,this->m_tc_id);
              dVar5 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar5,"Could not attach tessellation control shader",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                              ,0x2dd);
            }
            if (p_Var10->use_te == true) {
              (**(code **)(lVar9 + 0x10))(this->m_po_id,this->m_te_id);
              dVar5 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar5,"Could not attach tessellation evaluation shader",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                              ,0x2e3);
            }
            (**(code **)(lVar9 + 0xce8))(this->m_po_id);
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"Could not link program object",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x2e8);
            local_2b4 = 0.0;
            (**(code **)(lVar9 + 0x9d8))(this->m_po_id,0x8b82,&local_2b4);
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"glGetProgramiv() failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x2ee);
            if (local_2b4 != 1.4013e-45) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"A program object consisting of: ",0x20);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"[fragment shader] ",0x12);
              local_228 = (bool *)0x1b2a1c7;
              pcVar13 = fixed_sample_locations_values + 1;
              if (local_2b0->use_gs == false) {
                local_228 = fixed_sample_locations_values + 1;
              }
              pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_228);
              local_1f8 = (bool *)0x1b2a1da;
              if (local_2b0->use_tc == false) {
                local_1f8 = fixed_sample_locations_values + 1;
              }
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f8);
              if (local_2b0->use_te != false) {
                pcVar13 = "[tessellation evaluation shader] ";
              }
              local_200 = (bool *)pcVar13;
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_200);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                         "[vertex shader] ",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                         "failed to link, even though it should link successfully.",0x38);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar7,
                         "Program linking failed, even though the shader combination was valid",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                         ,0x2fa);
              __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            (**(code **)(lVar9 + 0x1680))(this->m_po_id);
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"glUseProgram() failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x2fe);
            goto LAB_00cc3cd8;
          }
        }
        else {
          if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
            GVar8 = 0;
            if (p_Var10->use_gs != false) {
              GVar8 = this->m_gs_program_id;
            }
            (**(code **)(lVar9 + 0x1688))
                      (this->m_pipeline_id,
                       (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_BIT,GVar8);
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"glUseProgramStages() failed for GL_GEOMETRY_SHADER_BIT_EXT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x2aa);
          }
          GVar8 = 0;
          if (p_Var10->use_tc != false) {
            GVar8 = this->m_tc_program_id;
          }
          (**(code **)(lVar9 + 0x1688))
                    (this->m_pipeline_id,
                     (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER_BIT,GVar8);
          dVar5 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar5,"glUseProgramStages() failed for GL_TESS_CONTROL_SHADER_BIT_EXT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2af);
          GVar8 = 0;
          if (p_Var10->use_te != false) {
            GVar8 = this->m_te_program_id;
          }
          (**(code **)(lVar9 + 0x1688))
                    (this->m_pipeline_id,
                     (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER_BIT,GVar8);
          dVar5 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar5,"glUseProgramStages() failed for GL_TESS_EVALUATION_SHADER_BIT_EXT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2b3);
          (**(code **)(lVar9 + 0x1698))(this->m_pipeline_id);
          dVar5 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar5,"glValidateProgramPipeline() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2b7);
          local_2b4 = 0.0;
          (**(code **)(lVar9 + 0x9a0))(this->m_pipeline_id,0x8b83,&local_2b4);
          dVar5 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar5,"glGetProgramPipelineiv() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2bd);
          if ((local_2b4 == 0.0) && (p_Var10->should_draw_call_fail == false)) {
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"A pipeline object consisting of: ",0x21);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"[fragment stage] ",0x11);
            local_228 = (bool *)0x1b2a02b;
            pcVar13 = fixed_sample_locations_values + 1;
            if (local_2b0->use_gs == false) {
              local_228 = fixed_sample_locations_values + 1;
            }
            pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_228);
            local_1f8 = (bool *)0x1b2a03d;
            if (local_2b0->use_tc == false) {
              local_1f8 = fixed_sample_locations_values + 1;
            }
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f8);
            if (local_2b0->use_te != false) {
              pcVar13 = "[tessellation evaluation stage] ";
            }
            local_200 = (bool *)pcVar13;
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                       "[vertex stage] ",0xf);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                       "was not validated successfully, even though it should.",0x36);
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar7,
                       "Pipeline object is considered invalid, even though the stage combination is valid"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                       ,0x2c8);
            __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
LAB_00cc3cd8:
          (**(code **)(lVar9 + 0x5e0))(0x8c89);
          dVar5 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar5,"glEnable(GL_RASTERIZER_DISCARD) failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x303);
          (**(code **)(lVar9 + 0x30))(p_Var10->tf_mode);
          if (p_Var10->should_draw_call_fail == false) {
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"glBeginTransformFeedback(GL_POINTS) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x30a);
            bVar2 = false;
          }
          else {
            iVar4 = (**(code **)(lVar9 + 0x800))();
            bVar2 = iVar4 == 0x502;
            if ((iVar4 != 0) && (iVar4 != 0x502)) {
              pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar7,
                         "Unexpected GL error in a beginTransformFeedback made on the program pipeline whoseprogram closest to TFB has no output varying specified"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                         ,0x31a);
              __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
          }
          (**(code **)(lVar9 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
          if (local_2b0->should_draw_call_fail == false) {
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"glDrawArrays() failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x323);
          }
          else {
            iVar4 = (**(code **)(lVar9 + 0x800))();
            if (iVar4 != 0x502) {
              pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar7,
                         "A draw call made using a program object lacking TES stage has not generated a GL_INVALID_OPERATION as specified"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                         ,0x32a);
              goto LAB_00cc44a4;
            }
          }
          (**(code **)(lVar9 + 0x638))();
          if (bVar2) {
            iVar4 = (**(code **)(lVar9 + 0x800))();
            if (iVar4 != 0x502) {
              pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar7,
                         "An endTransformFeedback made on inactive xfb has not generated a GL_INVALID_OPERATION as specified"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                         ,0x339);
LAB_00cc44a4:
              __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
          }
          else {
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"glEndTransformFeedback() failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x332);
          }
          (**(code **)(lVar9 + 0x4e8))(0x8c89);
          dVar5 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar5,"glDisable(GL_RASTERIZER_DISCARD) failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x33e);
          p_Var10 = local_2b0;
          if (local_2b0->should_draw_call_fail == false) {
            __s = (void *)(**(code **)(lVar9 + 0xd00))
                                    (0x8c8e,0,(long)local_2b0->expected_n_values << 4,3);
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"glMapBufferRange() failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x347);
            local_228 = (bool *)CONCAT44(local_228._4_4_,0x3f800000);
            local_1f8 = (bool *)CONCAT44(local_1f8._4_4_,0x40000000);
            local_200 = (bool *)CONCAT44(local_200._4_4_,0x40400000);
            local_2b4 = 4.0;
            local_238[0] = 0x40000000;
            local_1dc._0_4_ = 0x40400000;
            local_208[0] = 0x40800000;
            local_1e0 = 5.0;
            local_248[0] = 0x40400000;
            local_1e4 = 0x40800000;
            local_210[0] = 0x40a00000;
            local_1ec._4_4_ = 0x40c00000;
            local_258[0]._0_4_ = 0x40800000;
            local_1ec._0_4_ = 0x40a00000;
            local_218._0_4_ = 0x40c00000;
            local_1f0 = 7.0;
            lVar9 = (long)p_Var10->expected_n_values;
            if (0 < lVar9) {
              GVar1 = local_2b0->expected_data_source;
              lVar14 = 0;
              do {
                ppbVar11 = &local_1f8;
                ppbVar15 = &local_200;
                pfVar12 = &local_2b4;
                ppbVar18 = &local_228;
                if (GVar1 != (local_220->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER) {
                  ppbVar11 = (bool **)local_1dc;
                  ppbVar15 = (bool **)local_208;
                  pfVar12 = &local_1e0;
                  ppbVar18 = local_258 + 4;
                  if (GVar1 != (local_220->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER) {
                    ppbVar11 = (bool **)&local_1e4;
                    ppbVar15 = (bool **)local_210;
                    pfVar12 = (float *)((long)&local_1ec + 4);
                    ppbVar18 = local_258 + 2;
                    if (GVar1 != (local_220->super_TestCaseBase).m_glExtTokens.
                                 TESS_EVALUATION_SHADER) {
                      ppbVar11 = (bool **)&local_1ec;
                      ppbVar15 = &local_218;
                      pfVar12 = &local_1f0;
                      ppbVar18 = local_258;
                      if (GVar1 != 0x8b31) {
                        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (pTVar7,"Unrecognized expected data source",(char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                                   ,0x367);
                        goto LAB_00cc4436;
                      }
                    }
                  }
                }
                lVar17 = (long)(int)lVar14;
                fVar19 = *(float *)((long)__s + lVar17 * 4) - *(float *)ppbVar18;
                fVar20 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar20 = fVar19;
                }
                if (1e-05 < fVar20) {
LAB_00cc41ac:
                  local_1b0 = (undefined1  [8])
                              ((local_220->super_TestCaseBase).super_TestCase.super_TestNode.
                              m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Captured data ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
                  std::ostream::_M_insert<double>((double)*(float *)((long)__s + lVar17 * 4));
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                  std::ostream::_M_insert<double>((double)*(float *)((long)__s + lVar17 * 4 + 4));
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                  std::ostream::_M_insert<double>((double)*(float *)((long)__s + lVar17 * 4 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                  std::ostream::_M_insert<double>((double)*(float *)((long)__s + lVar17 * 4 + 0xc));
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"is different from the expected value ",0x25);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
                  std::ostream::_M_insert<double>((double)*(float *)ppbVar18);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                  std::ostream::_M_insert<double>((double)*(float *)ppbVar11);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                  std::ostream::_M_insert<double>((double)*(float *)ppbVar15);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                  std::ostream::_M_insert<double>((double)*pfVar12);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar7,"Invalid data captured",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                             ,0x377);
LAB_00cc4436:
                  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                }
                fVar19 = *(float *)((long)__s + lVar17 * 4 + 4) - *(float *)ppbVar11;
                fVar20 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar20 = fVar19;
                }
                if (1e-05 < fVar20) goto LAB_00cc41ac;
                fVar19 = *(float *)((long)__s + lVar17 * 4 + 8) - *(float *)ppbVar15;
                fVar20 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar20 = fVar19;
                }
                if (1e-05 < fVar20) goto LAB_00cc41ac;
                fVar19 = *(float *)((long)__s + lVar17 * 4 + 0xc) - *pfVar12;
                fVar20 = -fVar19;
                if (-fVar19 <= fVar19) {
                  fVar20 = fVar19;
                }
                if (1e-05 < fVar20) goto LAB_00cc41ac;
                lVar14 = lVar14 + 4;
              } while (lVar9 * 4 - lVar14 != 0);
            }
            memset(__s,0,lVar9 << 4);
            lVar9 = local_1dc._4_8_;
            (**(code **)(local_1dc._4_8_ + 0x1670))(0x8c8e);
            dVar5 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar5,"glUnmapBuffer() failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x37f);
            uVar16 = local_1d0;
            this = local_220;
          }
          if ((uVar16 & 1) == 0) {
            if (local_2b0->use_gs == true) {
              (**(code **)(lVar9 + 0x4e0))(this->m_po_id,this->m_gs_id);
              dVar5 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar5,"Could not detach geometry shader",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                              ,0x389);
            }
            if (local_2b0->use_tc == true) {
              (**(code **)(lVar9 + 0x4e0))(this->m_po_id,this->m_tc_id);
              dVar5 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar5,"Could not detach tessellation control shader",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                              ,0x38f);
            }
            if (local_2b0->use_te == true) {
              (**(code **)(lVar9 + 0x4e0))(this->m_po_id,this->m_te_id);
              dVar5 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar5,"Could not detach tessellation evaluation shader",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                              ,0x395);
            }
          }
        }
        p_Var10 = local_2b0 + 1;
      } while (p_Var10 != iStack_2a0._M_current);
    }
    uVar16 = CONCAT71((int7)(uVar16 >> 8),1);
    uVar3 = local_274 & 1;
    local_274 = 0;
    if (uVar3 == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      if (local_2a8 != (_test_descriptor *)0x0) {
        operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderXFB::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	typedef std::vector<_test_descriptor> _tests;
	typedef _tests::const_iterator		  _tests_const_iterator;

	/* Initialize ES test objects */
	initTest();

	/* Describe test iterations */
	_test_descriptor test_1; /* vs+tc+te+gs */
	_test_descriptor test_2; /* vs+tc+te */
	_test_descriptor test_3; /* vs+tc */
	_tests			 tests;

	if (m_is_geometry_shader_extension_supported)
	{
		test_1.expected_data_source  = m_glExtTokens.GEOMETRY_SHADER;
		test_1.expected_n_values	 = 2;
		test_1.should_draw_call_fail = false;
		test_1.requires_pipeline	 = false;
		test_1.tf_mode				 = GL_POINTS;
		test_1.use_gs				 = true;
		test_1.use_tc				 = true;
		test_1.use_te				 = true;

		tests.push_back(test_1);
	}

	test_2.expected_data_source  = m_glExtTokens.TESS_EVALUATION_SHADER;
	test_2.expected_n_values	 = 2;
	test_2.should_draw_call_fail = false;
	test_2.requires_pipeline	 = false;
	test_2.tf_mode				 = GL_POINTS;
	test_2.use_gs				 = false;
	test_2.use_tc				 = true;
	test_2.use_te				 = true;

	tests.push_back(test_2);

	/* Note: This is a special negative case */
	test_3.expected_data_source = m_glExtTokens.TESS_CONTROL_SHADER;
	test_3.expected_n_values	= 4;
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()) && isExtensionSupported("GL_NV_gpu_shader5"))
	{
		test_3.should_draw_call_fail = false;
		test_3.tf_mode				 = m_glExtTokens.PATCHES;
	}
	else
	{
		test_3.should_draw_call_fail = true;
		test_3.tf_mode				 = GL_POINTS;
	}
	test_3.requires_pipeline = true;
	test_3.use_gs			 = false;
	test_3.use_tc			 = true;
	test_3.use_te			 = false;

	tests.push_back(test_3);

	/* Use only one vertex per patch */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed.");

	/* This test runs in two iterations:
	 *
	 * 1) Shaders are attached to a program object at the beginning of
	 *    each test. The test then executes. Once it's completed, the
	 *    shaders are detached from the program object;
	 * 2) A pipeline object is used instead of a program object.
	 */
	for (int n_iteration = 0; n_iteration < 2; ++n_iteration)
	{
		bool use_pipeline_object = (n_iteration == 1);

		if (use_pipeline_object)
		{
			gl.bindProgramPipeline(m_pipeline_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() failed.");

			gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");
		}
		else
		{
			gl.bindProgramPipeline(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() failed.");

			/* The program object will be shortly re-linked so defer the glUseProgram() call */
		}

		/* Iterate through all tests */
		for (_tests_const_iterator test_iterator = tests.begin(); test_iterator != tests.end(); test_iterator++)
		{
			const _test_descriptor& test = *test_iterator;

			if (use_pipeline_object)
			{
				/* Configure the pipeline object */
				if (m_is_geometry_shader_extension_supported)
				{
					gl.useProgramStages(m_pipeline_id, m_glExtTokens.GEOMETRY_SHADER_BIT,
										test.use_gs ? m_gs_program_id : 0);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_GEOMETRY_SHADER_BIT_EXT");
				}

				gl.useProgramStages(m_pipeline_id, m_glExtTokens.TESS_CONTROL_SHADER_BIT,
									test.use_tc ? m_tc_program_id : 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_TESS_CONTROL_SHADER_BIT_EXT");

				gl.useProgramStages(m_pipeline_id, m_glExtTokens.TESS_EVALUATION_SHADER_BIT,
									test.use_te ? m_te_program_id : 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_TESS_EVALUATION_SHADER_BIT_EXT");

				/* Validate the pipeline object */
				gl.validateProgramPipeline(m_pipeline_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glValidateProgramPipeline() failed");

				/* Retrieve the validation result */
				glw::GLint validate_status = GL_FALSE;

				gl.getProgramPipelineiv(m_pipeline_id, GL_VALIDATE_STATUS, &validate_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() failed");

				if (validate_status == GL_FALSE && !test.should_draw_call_fail)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A pipeline object consisting of: "
									   << "[fragment stage] " << ((test.use_gs) ? "[geometry stage] " : "")
									   << ((test.use_tc) ? "[tessellation control stage] " : "")
									   << ((test.use_te) ? "[tessellation evaluation stage] " : "") << "[vertex stage] "
									   << "was not validated successfully, even though it should."
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Pipeline object is considered invalid, even though the stage combination is valid");
				}
			}
			else
			{
				if (test.requires_pipeline)
				{
					continue;
				}

				/* Attach the shaders to the program object as described in
				 * the test descriptor */
				if (test.use_gs)
				{
					gl.attachShader(m_po_id, m_gs_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach geometry shader");
				}

				if (test.use_tc)
				{
					gl.attachShader(m_po_id, m_tc_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach tessellation control shader");
				}

				if (test.use_te)
				{
					gl.attachShader(m_po_id, m_te_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach tessellation evaluation shader");
				}

				/* Link the program object */
				gl.linkProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Could not link program object");

				/* Has the linking succeeded? */
				glw::GLint link_status = GL_FALSE;

				gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

				if (link_status != GL_TRUE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A program object consisting of: "
									   << "[fragment shader] " << ((test.use_gs) ? "[geometry shader] " : "")
									   << ((test.use_tc) ? "[tessellation control shader] " : "")
									   << ((test.use_te) ? "[tessellation evaluation shader] " : "")
									   << "[vertex shader] "
									   << "failed to link, even though it should link successfully."
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Program linking failed, even though the shader combination was valid");
				}

				gl.useProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");
			}

			/* Render a single point */
			gl.enable(GL_RASTERIZER_DISCARD);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

			gl.beginTransformFeedback(test.tf_mode);

			bool didBeginXFBFail = false;
			if (!test.should_draw_call_fail)
			{
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) failed");
			}
			else
			{
				/* For the negative case, i.e. beginTransformFeedback with an invalid pipeline of {VS, TCS, FS},
				 * ES spec is not clear if beginTransformFeedback should error, so relax the requirment here so
				 * that test passes as long as either beginTransformFeedback or the next draw call raises
				 * INVALID_OPERATION */
				glw::GLint err = gl.getError();
				if (err == GL_INVALID_OPERATION)
				{
					didBeginXFBFail = true;
				}
				else if (err != GL_NO_ERROR)
				{
					TCU_FAIL("Unexpected GL error in a beginTransformFeedback made on the program pipeline whose"
							 "program closest to TFB has no output varying specified");
				}
			}

			{
				gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* count */);

				if (!test.should_draw_call_fail)
				{
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
				}
				else
				{
					if (gl.getError() != GL_INVALID_OPERATION)
					{
						TCU_FAIL("A draw call made using a program object lacking TES stage has"
								 " not generated a GL_INVALID_OPERATION as specified");
					}
				}
			}
			gl.endTransformFeedback();

			if (!didBeginXFBFail)
			{
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");
			}
			else
			{
				if (gl.getError() != GL_INVALID_OPERATION)
				{
					TCU_FAIL("An endTransformFeedback made on inactive xfb has not generated a "
							 "GL_INVALID_OPERATION as specified");
				}
			}

			gl.disable(GL_RASTERIZER_DISCARD);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) failed");

			if (!test.should_draw_call_fail)
			{
				/* Retrieve the captured result values */
				glw::GLfloat* result_ptr = (glw::GLfloat*)gl.mapBufferRange(
					GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
					sizeof(float) * 4 /* components */ * test.expected_n_values, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

				/* Verify the data */
				const glw::GLfloat epsilon			  = (glw::GLfloat)1e-5;
				const glw::GLfloat expected_gs_data[] = { 1.0f, 2.0f, 3.0f, 4.0f };
				const glw::GLfloat expected_tc_data[] = { 2.0f, 3.0f, 4.0f, 5.0f };
				const glw::GLfloat expected_te_data[] = { 3.0f, 4.0f, 5.0f, 6.0f };
				const glw::GLfloat expected_vs_data[] = { 4.0f, 5.0f, 6.0f, 7.0f };

				for (int n_value = 0; n_value < test.expected_n_values; ++n_value)
				{
					const glw::GLfloat* expected_data_ptr = NULL;
					const glw::GLfloat* captured_data_ptr = result_ptr + n_value * 4 /* components */;

					if (test.expected_data_source == m_glExtTokens.GEOMETRY_SHADER)
					{
						expected_data_ptr = expected_gs_data;
					}
					else if (test.expected_data_source == m_glExtTokens.TESS_CONTROL_SHADER)
					{
						expected_data_ptr = expected_tc_data;
					}
					else if (test.expected_data_source == m_glExtTokens.TESS_EVALUATION_SHADER)
					{
						expected_data_ptr = expected_te_data;
					}
					else if (test.expected_data_source == GL_VERTEX_SHADER)
					{
						expected_data_ptr = expected_vs_data;
					}
					else
					{
						TCU_FAIL("Unrecognized expected data source");
					}

					if (de::abs(captured_data_ptr[0] - expected_data_ptr[0]) > epsilon ||
						de::abs(captured_data_ptr[1] - expected_data_ptr[1]) > epsilon ||
						de::abs(captured_data_ptr[2] - expected_data_ptr[2]) > epsilon ||
						de::abs(captured_data_ptr[3] - expected_data_ptr[3]) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Captured data "
										   << "(" << captured_data_ptr[0] << ", " << captured_data_ptr[1] << ", "
										   << captured_data_ptr[2] << ", " << captured_data_ptr[3] << ")"
										   << "is different from the expected value "
										   << "(" << expected_data_ptr[0] << ", " << expected_data_ptr[1] << ", "
										   << expected_data_ptr[2] << ", " << expected_data_ptr[3] << ")"
										   << tcu::TestLog::EndMessage;

						TCU_FAIL("Invalid data captured");
					}
				}

				/* Unmap the buffer object, since we're done */
				memset(result_ptr, 0, sizeof(float) * 4 /* components */ * test.expected_n_values);

				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");
			} /* if (!test.should_draw_call_fail) */

			if (!use_pipeline_object)
			{
				/* Detach all shaders we attached to the program object at the beginning
				 * of the iteration */
				if (test.use_gs)
				{
					gl.detachShader(m_po_id, m_gs_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach geometry shader");
				}

				if (test.use_tc)
				{
					gl.detachShader(m_po_id, m_tc_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach tessellation control shader");
				}

				if (test.use_te)
				{
					gl.detachShader(m_po_id, m_te_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach tessellation evaluation shader");
				}

			} /* if (!use_pipeline_object) */
			else
			{
				/* We don't need to do anything with the pipeline object - stages will be
				 * re-defined in next iteration */
			}
		} /* for (all tests) */
	}	 /* for (all iterations) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}